

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O3

void __thiscall
MT32Emu::BReverbModelImpl<short>::setParameters
          (BReverbModelImpl<short> *this,Bit8u time,Bit8u level)

{
  Bit32u BVar1;
  uint uVar2;
  CombFilter<short> *pCVar3;
  CombFilter<short> **ppCVar4;
  Bit8u *pBVar5;
  int iVar6;
  uint uVar7;
  BReverbSettings *pBVar8;
  byte bVar9;
  Bit8u BVar10;
  ulong uVar11;
  
  iVar6 = (*(this->super_BReverbModel)._vptr_BReverbModel[2])();
  if ((char)iVar6 == '\0') {
    return;
  }
  uVar7 = level & 7;
  bVar9 = time & 7;
  if (this->tapDelayMode == false) {
    pBVar8 = this->currentSettings;
    uVar2 = pBVar8->numberOfCombs;
    if (1 < (ulong)uVar2) {
      ppCVar4 = this->combs;
      pBVar5 = pBVar8->feedbackFactors;
      uVar11 = 8;
      do {
        *(Bit8u *)(*(long *)((long)ppCVar4 + uVar11) + 0x19) =
             pBVar5[uVar11 & 0xffffffff | (ulong)bVar9];
        uVar11 = uVar11 + 8;
      } while ((ulong)uVar2 << 3 != uVar11);
    }
    if (((level | time) & 7) == 0) goto LAB_00180153;
  }
  else {
    pBVar8 = this->currentSettings;
    pCVar3 = *this->combs;
    BVar1 = pBVar8->outRPositions[bVar9];
    *(Bit32u *)&pCVar3->field_0x1c = pBVar8->outLPositions[bVar9];
    *(Bit32u *)&pCVar3[1].super_RingBuffer<short>._vptr_RingBuffer = BVar1;
    pCVar3->feedbackFactor = pBVar8->feedbackFactors[5 < bVar9 && 2 < (byte)uVar7];
    if (((level | time) & 7) == 0) {
LAB_00180153:
      this->dryAmp = '\0';
      this->wetLevel = '\0';
      return;
    }
    if ((bVar9 == 0) || ((byte)uVar7 == 1 && bVar9 == 1)) {
      BVar10 = pBVar8->dryAmps[(ulong)uVar7 + 8];
      goto LAB_00180144;
    }
  }
  BVar10 = pBVar8->dryAmps[uVar7];
LAB_00180144:
  this->dryAmp = BVar10;
  this->wetLevel = pBVar8->wetLevels[uVar7];
  return;
}

Assistant:

void setParameters(Bit8u time, Bit8u level) {
		if (!isOpen()) return;
		level &= 7;
		time &= 7;
		if (tapDelayMode) {
			TapDelayCombFilter<Sample> *comb = static_cast<TapDelayCombFilter<Sample> *> (*combs);
			comb->setOutputPositions(currentSettings.outLPositions[time], currentSettings.outRPositions[time & 7]);
			comb->setFeedbackFactor(currentSettings.feedbackFactors[((level < 3) || (time < 6)) ? 0 : 1]);
		} else {
			for (Bit32u i = 1; i < currentSettings.numberOfCombs; i++) {
				combs[i]->setFeedbackFactor(currentSettings.feedbackFactors[(i << 3) + time]);
			}
		}
		if (time == 0 && level == 0) {
			dryAmp = wetLevel = 0;
		} else {
			if (tapDelayMode && ((time == 0) || (time == 1 && level == 1))) {
				// Looks like MT-32 implementation has some minor quirks in this mode:
				// for odd level values, the output level changes sometimes depending on the time value which doesn't seem right.
				dryAmp = currentSettings.dryAmps[level + 8];
			} else {
				dryAmp = currentSettings.dryAmps[level];
			}
			wetLevel = currentSettings.wetLevels[level];
		}
	}